

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O1

bool __thiscall EditorsModel::isEmpty(EditorsModel *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool local_99;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QArrayData *local_78;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  local_98._forAlignment = -NAN;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  iVar4 = (**(code **)(*(long *)this + 0x78))();
  local_99 = iVar4 < 1;
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar5 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
      bVar2 = 0 < iVar5;
      if (0 < iVar5) {
        iVar5 = 1;
        do {
          local_60 = 0xffffffffffffffff;
          local_58 = 0;
          uStack_50 = 0;
          (**(code **)(*(long *)this + 0x60))(local_48,this,iVar4,iVar5 + -1,&local_60);
          (**(code **)(*(long *)this + 0x90))(&local_98,this,local_48,0);
          QVariant::toString();
          lVar3 = local_68;
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          QVariant::~QVariant((QVariant *)&local_98);
          if (lVar3 != 0) {
            if (bVar2) {
              return local_99;
            }
            break;
          }
          local_98._forAlignment = -NAN;
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          iVar6 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
          bVar2 = iVar5 < iVar6;
          bVar1 = iVar5 < iVar6;
          iVar5 = iVar5 + 1;
        } while (bVar1);
      }
      iVar4 = iVar4 + 1;
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar5 = (**(code **)(*(long *)this + 0x78))(this,&local_98);
      local_99 = iVar5 <= iVar4;
    } while (iVar4 < iVar5);
  }
  return local_99;
}

Assistant:

bool EditorsModel::isEmpty() const
{
    for(int r=0;r<rowCount();r++) {
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                return false;
            }
        }
    }
    return true;
}